

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void tlsio_openssl_dowork(CONCRETE_IO_HANDLE tls_io)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  TLS_IO_INSTANCE *tls_io_instance;
  LOGGER_LOG l;
  CONCRETE_IO_HANDLE tls_io_local;
  
  if (tls_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_dowork",0x636,1,"NULL tls_io.");
    }
  }
  else {
    iVar1 = *(int *)((long)tls_io + 0x68);
    if ((iVar1 != 0) && ((iVar1 - 1U < 2 || ((iVar1 != 3 && (iVar1 == 4)))))) {
      write_outgoing_bytes((TLS_IO_INSTANCE *)tls_io,(ON_SEND_COMPLETE)0x0,(void *)0x0);
    }
    if ((*(int *)((long)tls_io + 0x68) != 0) &&
       (xio_dowork(*tls_io), *(int *)((long)tls_io + 0x68) == 3)) {
      *(undefined4 *)((long)tls_io + 0x68) = 6;
      tlsio_openssl_close(tls_io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      indicate_open_complete((TLS_IO_INSTANCE *)tls_io,IO_OPEN_ERROR);
    }
  }
  return;
}

Assistant:

void tlsio_openssl_dowork(CONCRETE_IO_HANDLE tls_io)
{
    if (tls_io == NULL)
    {
        LogError("NULL tls_io.");
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        switch (tls_io_instance->tlsio_state)
        {
        case TLSIO_STATE_OPENING_UNDERLYING_IO:
        case TLSIO_STATE_IN_HANDSHAKE:
        case TLSIO_STATE_OPEN:
            /* this is needed in order to pump out bytes produces by OpenSSL for things like renegotiation */
            write_outgoing_bytes(tls_io_instance, NULL, NULL);
            break;
        case TLSIO_STATE_NOT_OPEN:
        case TLSIO_STATE_HANDSHAKE_FAILED:
        case TLSIO_STATE_CLOSING:
        case TLSIO_STATE_ERROR:
        default:
            break;
        }

        if (tls_io_instance->tlsio_state != TLSIO_STATE_NOT_OPEN)
        {
            /* Same behavior as schannel */
            xio_dowork(tls_io_instance->underlying_io);

            if (tls_io_instance->tlsio_state == TLSIO_STATE_HANDSHAKE_FAILED)
            {
                // The handshake failed so we need to close. The tlsio becomes aware of the
                // handshake failure during an on_bytes_received while the underlying
                // xio_dowork is pumping data out of the socket in a while loop. The tlsio can't
                // close down during the callback because that would mean the xio_dowork would
                // be trying to read from a closed socket. So instead, the tlsio sets its state
                // to TLSIO_STATE_HANDSHAKE_FAILED during the on_bytes_received callback,
                // can then gracefully shut things down here.
                //
                // Set the state to TLSIO_STATE_ERROR so close won't gripe about the state
                tls_io_instance->tlsio_state = TLSIO_STATE_ERROR;
                tlsio_openssl_close(tls_io_instance, NULL, NULL);
                indicate_open_complete(tls_io_instance, IO_OPEN_ERROR);
            }
        }
    }
}